

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenEnumDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,FieldDef *field)

{
  string local_b0;
  byte local_8d;
  byte local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  EnumVal *local_38;
  EnumVal *enum_val;
  EnumDef *enum_def;
  Value *value;
  FieldDef *field_local;
  CSharpGenerator *this_local;
  
  enum_def = (EnumDef *)&field->value;
  value = (Value *)field;
  field_local = (FieldDef *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  if ((field->value).type.enum_def != (EnumDef *)0x0) {
    enum_val = (EnumVal *)(field->value).type.enum_def;
    local_38 = EnumDef::FindByValue((EnumDef *)enum_val,&(field->value).constant);
    local_79 = 0;
    local_8d = 0;
    if (local_38 == (EnumVal *)0x0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&(enum_def->super_Definition).file);
    }
    else {
      NamespacedName_abi_cxx11_(&local_78,this,(Definition *)enum_val);
      local_79 = 1;
      std::operator+(&local_58,&local_78,".");
      local_8d = 1;
      Name_abi_cxx11_(&local_b0,this,local_38);
      std::operator+(__return_storage_ptr__,&local_58,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if ((local_8d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    if ((local_79 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_78);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("value.type.enum_def",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_csharp.cpp"
                ,0x149,
                "std::string flatbuffers::csharp::CSharpGenerator::GenEnumDefaultValue(const FieldDef &) const"
               );
}

Assistant:

std::string GenEnumDefaultValue(const FieldDef &field) const {
    auto &value = field.value;
    FLATBUFFERS_ASSERT(value.type.enum_def);
    auto &enum_def = *value.type.enum_def;
    auto enum_val = enum_def.FindByValue(value.constant);
    return enum_val ? (NamespacedName(enum_def) + "." + Name(*enum_val))
                    : value.constant;
  }